

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::ConstantDerivateCase::verify
          (ConstantDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 local_58 [16];
  Vec4 threshold;
  Vec4 reference;
  
  reference.m_data[0] = 0.0;
  reference.m_data[1] = 0.0;
  reference.m_data[2] = 0.0;
  reference.m_data[3] = 0.0;
  TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)local_58);
  auVar3 = *(undefined1 (*) [16])(this->super_TriangleDerivateCase).m_derivScale.m_data;
  auVar2._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
  auVar2._8_4_ = auVar3._8_4_ ^ 0x80000000;
  auVar2._12_4_ = auVar3._12_4_ ^ 0x80000000;
  auVar3 = maxps(auVar2,auVar3);
  threshold.m_data = (float  [4])divps(local_58,auVar3);
  bVar1 = verifyConstantDerivate
                    (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,
                     (PixelBufferAccess *)sig,(this->super_TriangleDerivateCase).m_dataType,
                     &reference,&threshold,&(this->super_TriangleDerivateCase).m_derivScale,
                     &(this->super_TriangleDerivateCase).m_derivBias,LOG_ALL);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool ConstantDerivateCase::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4 reference	(0.0f); // Derivate of constant argument should always be 0
	const tcu::Vec4	threshold	= getSurfaceThreshold() / abs(m_derivScale);

	return verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
								  reference, threshold, m_derivScale, m_derivBias);
}